

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O2

bool __thiscall Fossilize::FeatureFilter::Impl::pnext_chain_is_supported(Impl *this,void *pNext)

{
  VkImageAspectFlags *pVVar1;
  int iVar2;
  VkBool32 VVar3;
  DeviceQueryInterface *pDVar4;
  ulong uVar5;
  char cVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  undefined7 extraout_var;
  size_type sVar10;
  uint32_t i_2;
  undefined4 uVar11;
  ulong in_RCX;
  byte bVar12;
  uint32_t i;
  ulong uVar13;
  VkPipelineRasterizationDepthClipStateCreateInfoEXT *clip;
  VkImageLayout layout;
  char *pcVar14;
  long lVar15;
  uint32_t i_1;
  bool bVar16;
  bool bVar17;
  uint uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  allocator local_14a;
  allocator local_149;
  VkPhysicalDeviceImageRobustnessFeaturesEXT robust_image;
  VkPhysicalDeviceFeatures2 pdf2;
  
  do {
    uVar11 = (undefined4)in_RCX;
    bVar16 = (int *)pNext == (int *)0x0;
    if (bVar16) {
      return true;
    }
    iVar2 = *pNext;
    if (iVar2 + 0xc462d4a0U < 2) {
      VVar3 = (this->features).ycbcr_conversion.samplerYcbcrConversion;
joined_r0x00109f92:
      if (VVar3 == 0) {
        return false;
      }
    }
    else {
      if (iVar2 + 0xc461abbfU < 2) {
        VVar3 = (this->features).dynamic_rendering_local_read.dynamicRenderingLocalRead;
        goto joined_r0x00109f92;
      }
      if (iVar2 == 0x3b9b3762) {
        VVar3 = (this->features).transform_feedback.geometryStreams;
        goto joined_r0x00109f92;
      }
      if (iVar2 == 0x3b9b75e2) {
        if ((this->features).dynamic_rendering.dynamicRendering == 0) {
          return false;
        }
        for (uVar13 = 0; uVar13 < *(uint *)((long)pNext + 0x14); uVar13 = uVar13 + 1) {
          iVar2 = *(int *)(*(long *)((long)pNext + 0x18) + uVar13 * 4);
          if (((iVar2 != 0) && (pDVar4 = this->query, pDVar4 != (DeviceQueryInterface *)0x0)) &&
             (cVar6 = (**(code **)(*(long *)pDVar4 + 0x10))(pDVar4,iVar2,0x80), cVar6 == '\0')) {
            return false;
          }
        }
        if (((*(int *)((long)pNext + 0x20) != 0) &&
            (pDVar4 = this->query, pDVar4 != (DeviceQueryInterface *)0x0)) &&
           (cVar6 = (**(code **)(*(long *)pDVar4 + 0x10))(pDVar4,*(int *)((long)pNext + 0x20),0x200)
           , cVar6 == '\0')) {
          return bVar16;
        }
        if (((*(int *)((long)pNext + 0x24) != 0) &&
            (pDVar4 = this->query, pDVar4 != (DeviceQueryInterface *)0x0)) &&
           (cVar6 = (**(code **)(*(long *)pDVar4 + 0x10))(pDVar4,*(int *)((long)pNext + 0x24),0x200)
           , cVar6 == '\0')) {
          return bVar16;
        }
        if (*(uint *)((long)pNext + 0x20) != 0) {
          uVar8 = *(uint *)((long)pNext + 0x24);
          in_RCX = (ulong)uVar8;
          if (uVar8 != 0 && *(uint *)((long)pNext + 0x20) != uVar8) {
            return bVar16;
          }
        }
        if (*(uint *)((long)pNext + 0x10) != 0) {
          uVar8 = (this->props).multiview.maxMultiviewViewCount;
          uVar9 = -1 << ((byte)uVar8 & 0x1f);
          in_RCX = 0;
          if (0x1f < uVar8) {
            uVar9 = 0;
          }
          if ((uVar9 & *(uint *)((long)pNext + 0x10)) != 0) {
            return bVar16;
          }
        }
      }
      else if (iVar2 == 0x3b9b9908) {
        if ((this->features).multiview.multiview == 0) {
          return false;
        }
        uVar8 = (this->props).multiview.maxMultiviewViewCount;
        uVar9 = -1 << ((byte)uVar8 & 0x1f);
        if (0x1f < uVar8) {
          uVar9 = 0;
        }
        uVar13 = 0;
        while (*(uint *)((long)pNext + 0x10) != uVar13) {
          lVar15 = uVar13 * 4;
          uVar13 = uVar13 + 1;
          if ((*(uint *)(*(long *)((long)pNext + 0x18) + lVar15) & uVar9) != 0) {
            return false;
          }
        }
        in_RCX = (ulong)*(uint *)((long)pNext + 0x30);
        uVar13 = 0;
        while (in_RCX != uVar13) {
          lVar15 = uVar13 * 4;
          uVar13 = uVar13 + 1;
          if ((*(uint *)(*(long *)((long)pNext + 0x38) + lVar15) & uVar9) != 0) {
            return false;
          }
        }
      }
      else if (iVar2 == 0x3b9bd3a0) {
        std::__cxx11::string::string
                  ((string *)&pdf2,"VK_EXT_pipeline_robustness",(allocator *)&robust_image);
        sVar10 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)this,(key_type *)&pdf2);
        std::__cxx11::string::_M_dispose();
        if (sVar10 == 0) {
          return false;
        }
        if (((((*(int *)((long)pNext + 0x10) != 0) || (*(int *)((long)pNext + 0x1c) != 0)) ||
             (*(int *)((long)pNext + 0x14) != 0)) || (*(int *)((long)pNext + 0x18) != 0)) &&
           ((this->features).pipeline_robustness.pipelineRobustness == 0)) {
          return false;
        }
        pDVar4 = this->query;
        if (pDVar4 == (DeviceQueryInterface *)0x0) {
          return false;
        }
        bVar16 = true;
        if ((*(int *)((long)pNext + 0x10) != 3) && (*(int *)((long)pNext + 0x18) != 3)) {
          bVar16 = *(int *)((long)pNext + 0x14) == 3;
        }
        if (*(int *)((long)pNext + 0x1c) == 3) {
          memset(&pdf2,0,0xf0);
          pdf2.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
          robust_image.robustImageAccess = 0;
          robust_image._20_4_ = 0;
          robust_image.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT;
          robust_image._4_4_ = 0;
          robust_image.pNext = (void *)0x0;
          pdf2.pNext = &robust_image;
          (**(code **)(*(long *)pDVar4 + 0x20))(pDVar4);
          VVar3 = robust_image._20_4_;
joined_r0x0010a35e:
          if (VVar3 == 0) {
            return false;
          }
        }
        else if (*(int *)((long)pNext + 0x1c) == 2) {
          memset(&pdf2,0,0xf0);
          pdf2.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
          robust_image.robustImageAccess = 0;
          robust_image._20_4_ = 0;
          robust_image.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES;
          robust_image._4_4_ = 0;
          robust_image.pNext = (void *)0x0;
          pdf2.pNext = &robust_image;
          (**(code **)(*(long *)pDVar4 + 0x20))(pDVar4);
          VVar3 = robust_image.robustImageAccess;
          goto joined_r0x0010a35e;
        }
        if (bVar16) {
          bVar16 = false;
          memset(&pdf2,0,0xf0);
          pdf2.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2;
          robust_image.robustImageAccess = 0;
          robust_image._20_4_ = 0;
          robust_image.sType = VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT;
          robust_image._4_4_ = 0;
          robust_image.pNext = (void *)0x0;
          pdf2.pNext = &robust_image;
          (**(code **)(*(long *)this->query + 0x20))(this->query,&pdf2);
          VVar3 = robust_image.robustImageAccess;
joined_r0x00109b5a:
          if (VVar3 == 0) {
            return bVar16;
          }
        }
      }
      else {
        if (iVar2 == 0x3b9c4cb9) {
          pcVar14 = "VK_EXT_discard_rectangles";
        }
        else {
          if (iVar2 != 0x3b9c5489) {
            if (iVar2 == 0x3b9c5871) {
              if (*(int *)((long)pNext + 0x14) != 0) {
                VVar3 = (this->features).depth_clip.depthClipEnable;
                goto joined_r0x00109f92;
              }
              goto LAB_0010a3e7;
            }
            if (iVar2 == 0x3b9c9309) {
              std::__cxx11::string::string
                        ((string *)&pdf2,"VK_KHR_maintenance2",(allocator *)&robust_image);
              sVar10 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                *)this,(key_type *)&pdf2);
              if (sVar10 == 0) {
                uVar8 = this->api_version;
                std::__cxx11::string::_M_dispose();
                if (uVar8 < 0x401000) {
                  return false;
                }
              }
              else {
                std::__cxx11::string::_M_dispose();
              }
              uVar13 = 0xffffffffffffffff;
              lVar15 = 8;
              while (uVar13 = uVar13 + 1, uVar13 < *(uint *)((long)pNext + 0x10)) {
                pVVar1 = (VkImageAspectFlags *)(*(long *)((long)pNext + 0x18) + lVar15);
                lVar15 = lVar15 + 0xc;
                bVar16 = aspect_mask_is_supported(this,*pVVar1);
                if (!bVar16) {
                  return false;
                }
              }
              goto LAB_0010a3e7;
            }
            if (iVar2 == 0x3b9c930b) {
              std::__cxx11::string::string
                        ((string *)&pdf2,"VK_KHR_maintenance2",(allocator *)&robust_image);
              sVar10 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                *)this,(key_type *)&pdf2);
              if (sVar10 == 0) {
                uVar8 = this->api_version;
                std::__cxx11::string::_M_dispose();
                if (uVar8 < 0x401000) {
                  return false;
                }
              }
              else {
                std::__cxx11::string::_M_dispose();
              }
              goto LAB_0010a3e7;
            }
            if (iVar2 == 0x3b9cc5d1) {
              std::__cxx11::string::string
                        ((string *)&pdf2,"VK_EXT_sampler_filter_minmax",(allocator *)&robust_image);
              sVar10 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                *)this,(key_type *)&pdf2);
              if (sVar10 == 0) {
                VVar3 = (this->features).vk12.samplerFilterMinmax;
                std::__cxx11::string::_M_dispose();
                if (VVar3 == 0) {
                  return false;
                }
              }
              else {
                std::__cxx11::string::_M_dispose();
              }
              if (2 < *(uint *)((long)pNext + 0x10)) {
                return false;
              }
              goto LAB_0010a3e7;
            }
            if (iVar2 == 0x3b9cf898) {
              pcVar14 = "VK_EXT_sample_locations";
              goto LAB_0010a002;
            }
            if (iVar2 == 0x3b9cf89a) {
              std::__cxx11::string::string
                        ((string *)&pdf2,"VK_EXT_sample_locations",(allocator *)&robust_image);
              sVar10 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                *)this,(key_type *)&pdf2);
              std::__cxx11::string::_M_dispose();
              if (sVar10 == 0) {
                return false;
              }
              if ((*(int *)((long)pNext + 0x10) == 0) || (*(int *)((long)pNext + 0x34) == 0))
              goto LAB_0010a3e7;
              if ((this->props).sample_locations.maxSampleLocationGridSize.width <
                  *(uint *)((long)pNext + 0x2c)) {
                return false;
              }
              if ((this->props).sample_locations.maxSampleLocationGridSize.height <
                  *(uint *)((long)pNext + 0x30)) {
                return false;
              }
              VVar3 = (this->props).sample_locations.sampleLocationSampleCounts &
                      *(uint *)((long)pNext + 0x28);
              goto joined_r0x00109f92;
            }
            if (iVar2 == 0x3b9d0c22) {
              VVar3 = (this->features).blend_operation_advanced.advancedBlendCoherentOperations;
              goto joined_r0x00109f92;
            }
            if (iVar2 == 0x3ba3ab71) {
              VVar3 = (this->features).depth_clamp_control.depthClampControl;
              goto joined_r0x00109f92;
            }
            if (iVar2 == 0x3b9db031) {
              std::__cxx11::string::string
                        ((string *)&pdf2,"VK_EXT_vertex_attribute_divisor",&local_149);
              sVar10 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                *)this,(key_type *)&pdf2);
              if (sVar10 == 0) {
                std::__cxx11::string::string
                          ((string *)&robust_image,"VK_KHR_vertex_attribute_divisor",&local_14a);
                sVar10 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                  *)this,(key_type *)&robust_image);
                std::__cxx11::string::_M_dispose();
                std::__cxx11::string::_M_dispose();
                if (sVar10 == 0) {
                  return false;
                }
              }
              else {
                std::__cxx11::string::_M_dispose();
              }
              uVar8 = 0;
              bVar7 = 0;
              bVar12 = 0;
              for (uVar13 = 0; *(uint *)((long)pNext + 0x10) != uVar13; uVar13 = uVar13 + 1) {
                uVar9 = *(uint *)(*(long *)((long)pNext + 0x18) + 4 + uVar13 * 8);
                bVar7 = bVar7 | uVar9 != 1;
                bVar12 = bVar12 | uVar9 == 0;
                if (uVar8 <= uVar9) {
                  uVar8 = uVar9;
                }
              }
              if ((this->props).attribute_divisor.maxVertexAttribDivisor < uVar8) {
                return bVar16;
              }
              if ((bool)(bVar12 & (this->features).attribute_divisor.
                                  vertexAttributeInstanceRateZeroDivisor == 0)) {
                return bVar16;
              }
              bVar17 = (this->features).attribute_divisor.vertexAttributeInstanceRateDivisor == 0;
              in_RCX = (ulong)CONCAT31((int3)(*(uint *)((long)pNext + 0x10) >> 8),bVar17);
              if ((bool)(bVar7 & bVar17)) {
                return bVar16;
              }
              goto LAB_0010a3e7;
            }
            if (iVar2 == 0x3b9dd359) {
              if (this->api_version < 0x402000) {
                std::__cxx11::string::string
                          ((string *)&pdf2,"VK_KHR_depth_stencil_resolve",(allocator *)&robust_image
                          );
                sVar10 = std::
                         _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                  *)this,(key_type *)&pdf2);
                std::__cxx11::string::_M_dispose();
                if (sVar10 == 0) {
                  return false;
                }
              }
              if (*(VkAttachmentReference2 **)((long)pNext + 0x18) != (VkAttachmentReference2 *)0x0)
              {
                bVar16 = attachment_reference2_is_supported
                                   (this,*(VkAttachmentReference2 **)((long)pNext + 0x18));
                if (!bVar16) {
                  return false;
                }
                uVar8 = *(uint *)((long)pNext + 0x10);
                if ((uVar8 != 0) &&
                   (((this->props).ds_resolve.supportedDepthResolveModes & uVar8) == 0)) {
                  return false;
                }
                uVar9 = *(uint *)((long)pNext + 0x14);
                in_RCX = (ulong)uVar9;
                if ((uVar9 != 0) &&
                   (((this->props).ds_resolve.supportedStencilResolveModes & uVar9) == 0)) {
                  return false;
                }
                if (uVar8 == uVar9) {
                  if (uVar8 == 0x10) {
                    return false;
                  }
                }
                else {
                  uVar13 = (ulong)(uVar9 != 0) << 2 | 0x11e8;
                  if (uVar8 == 0) {
                    uVar13 = 0x11e8;
                  }
                  if (uVar9 == 0x10) {
                    return false;
                  }
                  if (uVar8 == 0x10) {
                    return false;
                  }
                  if (*(int *)((this->props2).properties.deviceName + (uVar13 - 0x6c)) == 0) {
                    return false;
                  }
                }
              }
              goto LAB_0010a3e7;
            }
            if (iVar2 == 0x3b9e1d92) {
              VVar3 = (this->features).fragment_density.fragmentDensityMap;
              goto joined_r0x00109f92;
            }
            if (iVar2 == 0x3b9e38e9) goto LAB_0010a3e7;
            if (iVar2 == 0x3b9e3cd0) {
              if ((this->features).fragment_shading_rate.attachmentFragmentShadingRate == 0) {
                return false;
              }
              if (*(VkAttachmentReference2 **)((long)pNext + 0x10) != (VkAttachmentReference2 *)0x0)
              {
                bVar16 = attachment_reference2_is_supported
                                   (this,*(VkAttachmentReference2 **)((long)pNext + 0x10));
                if (!bVar16) {
                  return false;
                }
                uVar13 = *(ulong *)((long)pNext + 0x18);
                uVar9 = (uint)uVar13;
                uVar18 = (uint)(uVar13 >> 0x20);
                auVar19._0_4_ = -(uint)(uVar9 == 0);
                auVar19._4_4_ = -(uint)(uVar9 == 0);
                auVar19._8_4_ = -(uint)(uVar18 == 0);
                auVar19._12_4_ = -(uint)(uVar18 == 0);
                uVar8 = movmskpd((int)CONCAT71(extraout_var,bVar16),auVar19);
                if ((uVar8 & 1) != 0) {
                  return false;
                }
                auVar21._8_4_ =
                     (this->props).fragment_shading_rate.minFragmentShadingRateAttachmentTexelSize.
                     width;
                auVar21._12_4_ =
                     (this->props).fragment_shading_rate.minFragmentShadingRateAttachmentTexelSize.
                     height;
                auVar21._0_8_ = uVar13;
                auVar20._8_8_ = uVar13;
                auVar20._0_4_ =
                     (this->props).fragment_shading_rate.maxFragmentShadingRateAttachmentTexelSize.
                     width;
                auVar20._4_4_ =
                     (this->props).fragment_shading_rate.maxFragmentShadingRateAttachmentTexelSize.
                     height;
                auVar20 = auVar20 ^ _DAT_00111740;
                auVar21 = auVar21 ^ _DAT_00111740;
                auVar22._0_4_ = -(uint)(auVar20._0_4_ < auVar21._0_4_);
                auVar22._4_4_ = -(uint)(auVar20._4_4_ < auVar21._4_4_);
                auVar22._8_4_ = -(uint)(auVar20._8_4_ < auVar21._8_4_);
                auVar22._12_4_ = -(uint)(auVar20._12_4_ < auVar21._12_4_);
                uVar11 = movmskps(uVar11,auVar22);
                if ((char)uVar11 != '\0') {
                  return false;
                }
                if ((byte)((byte)uVar8 >> 1) != 0) {
                  return false;
                }
                uVar5 = (ulong)uVar18;
                if (uVar18 < uVar9) {
                  uVar5 = uVar13;
                }
                if (uVar18 < uVar9) {
                  uVar13 = (ulong)uVar18;
                }
                in_RCX = uVar13 & 0xffffffff;
                if ((this->props).fragment_shading_rate.
                    maxFragmentShadingRateAttachmentTexelSizeAspectRatio <
                    (uint)((uVar5 & 0xffffffff) / in_RCX)) {
                  return false;
                }
              }
              goto LAB_0010a3e7;
            }
            if (iVar2 == 0x3b9e3cd1) {
              VVar3 = (this->features).fragment_shading_rate.pipelineFragmentShadingRate;
              goto joined_r0x00109f92;
            }
            if (iVar2 == 0x3b9e7769) {
              if ((this->features).separate_ds_layout.separateDepthStencilLayouts == 0) {
                return false;
              }
              layout = *(VkImageLayout *)((long)pNext + 0x10);
LAB_00109dfd:
              bVar16 = image_layout_is_supported(this,layout);
              if (!bVar16) {
                return false;
              }
              goto LAB_0010a3e7;
            }
            if (iVar2 == 0x3b9e776a) {
              if ((this->features).separate_ds_layout.separateDepthStencilLayouts == 0) {
                return false;
              }
              bVar16 = image_layout_is_supported(this,*(VkImageLayout *)((long)pNext + 0x10));
              if (!bVar16) {
                return false;
              }
              layout = *(VkImageLayout *)((long)pNext + 0x14);
              goto LAB_00109dfd;
            }
            if (iVar2 == 0x3b9eaa31) {
              std::__cxx11::string::string
                        ((string *)&pdf2,"VK_EXT_provoking_vertex",(allocator *)&robust_image);
              sVar10 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                *)this,(key_type *)&pdf2);
              std::__cxx11::string::_M_dispose();
              if (sVar10 == 0) {
                return false;
              }
              if (*(int *)((long)pNext + 0x10) == 1) {
                VVar3 = (this->features).provoking_vertex.provokingVertexLast;
                goto joined_r0x00109f92;
              }
              goto LAB_0010a3e7;
            }
            if (iVar2 == 0x3b9ebdb9) {
              iVar2 = *(int *)((long)pNext + 0x10);
              if ((iVar2 == 1) && ((this->features).line_rasterization.rectangularLines == 0)) {
                return false;
              }
              if ((iVar2 == 2) && ((this->features).line_rasterization.bresenhamLines == 0)) {
                return false;
              }
              if ((iVar2 == 3) && ((this->features).line_rasterization.smoothLines == 0)) {
                return false;
              }
              if (*(int *)((long)pNext + 0x14) == 1) {
                if ((iVar2 == 1) &&
                   ((this->features).line_rasterization.stippledRectangularLines == 0)) {
                  return false;
                }
                if ((iVar2 == 2) &&
                   ((this->features).line_rasterization.stippledBresenhamLines == 0)) {
                  return false;
                }
                if (iVar2 == 3) {
                  VVar3 = (this->features).line_rasterization.stippledSmoothLines;
                  goto joined_r0x00109f92;
                }
              }
              goto LAB_0010a3e7;
            }
            if (iVar2 == 0x3b9f1b7a) {
              std::__cxx11::string::string
                        ((string *)&pdf2,"VK_EXT_depth_bias_control",(allocator *)&robust_image);
              sVar10 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                *)this,(key_type *)&pdf2);
              std::__cxx11::string::_M_dispose();
              if (sVar10 == 0) {
                return false;
              }
              if ((*(int *)((long)pNext + 0x10) == 1) &&
                 ((this->features).depth_bias_control.
                  leastRepresentableValueForceUnormRepresentation == 0)) {
                return false;
              }
              if (*(int *)((long)pNext + 0x10) == 2) {
                VVar3 = (this->features).depth_bias_control.floatRepresentation;
                goto joined_r0x00109f92;
              }
              goto LAB_0010a3e7;
            }
            if (iVar2 == 0x3b9f2b18) {
              std::__cxx11::string::string
                        ((string *)&pdf2,"VK_EXT_custom_border_color",(allocator *)&robust_image);
              sVar10 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                                *)this,(key_type *)&pdf2);
              std::__cxx11::string::_M_dispose();
              if (sVar10 == 0) {
                return false;
              }
              if ((this->features).custom_border_color.customBorderColorWithoutFormat == 0 &&
                  *(int *)((long)pNext + 0x20) == 0) {
                return false;
              }
              goto LAB_0010a3e7;
            }
            if (iVar2 == 0x3b9f36d0) {
LAB_0010991f:
              VVar3 = (this->features).graphics_pipeline_library.graphicsPipelineLibrary;
              goto joined_r0x00109f92;
            }
            if (iVar2 == 0x3b9f9490) {
              VVar3 = (this->features).synchronization2.synchronization2;
              goto joined_r0x00109f92;
            }
            if (iVar2 == 0x3b9fac02) goto LAB_0010991f;
            if (iVar2 == 0x3ba0251a) {
              if ((this->features).mutable_descriptor_type.mutableDescriptorType == 0) {
                return false;
              }
              for (in_RCX = 0; in_RCX != *(uint *)((long)pNext + 0x10); in_RCX = in_RCX + 1) {
                for (uVar13 = 0; *(uint *)(*(long *)((long)pNext + 0x18) + in_RCX * 0x10) != uVar13;
                    uVar13 = uVar13 + 1) {
                  uVar8 = *(uint *)(*(long *)(*(long *)((long)pNext + 0x18) + in_RCX * 0x10 + 8) +
                                   uVar13 * 4);
                  if (7 < uVar8) {
                    return false;
                  }
                  if (uVar8 == 1) {
                    return false;
                  }
                }
              }
              goto LAB_0010a3e7;
            }
            if (iVar2 == 0x3ba034b9) {
              VVar3 = (this->features).depth_clip_control.depthClipControl;
              goto joined_r0x00109f92;
            }
            if (iVar2 == 0x3ba086c2) {
              VVar3 = (this->features).multisampled_render_to_single_sampled.
                      multisampledRenderToSingleSampled;
              goto joined_r0x00109f92;
            }
            if (iVar2 == 0x3ba09a49) {
              VVar3 = (this->features).color_write_enable.colorWriteEnable;
              goto joined_r0x00109f92;
            }
            if (iVar2 == 0x3ba10f79) {
              VVar3 = (this->features).border_color_swizzle.borderColorSwizzle;
              goto joined_r0x00109f92;
            }
            if (iVar2 == 0x3ba1c711) {
              VVar3 = (this->features).subpass_merge_feedback.subpassMergeFeedback;
              goto joined_r0x00109f92;
            }
            if (iVar2 == 0x3ba1f5f5) {
              VVar3 = (this->features).maintenance5.maintenance5;
              goto joined_r0x00109f92;
            }
            if (iVar2 != 0x3b9d3ee8) {
              fprintf(_stderr,
                      "Fossilize ERROR: Unrecognized pNext sType: %u. Treating as unsupported.\n");
              fflush(_stderr);
              return false;
            }
            in_RCX = (ulong)*(uint *)((long)pNext + 0x10);
            uVar8 = 0;
            for (uVar13 = 0; in_RCX != uVar13; uVar13 = uVar13 + 1) {
              uVar8 = uVar8 | *(uint *)(*(long *)((long)pNext + 0x18) + uVar13 * 4);
            }
            if (((uVar8 & 2) != 0) &&
               ((this->features).descriptor_indexing.descriptorBindingUpdateUnusedWhilePending == 0)
               ) {
              return bVar16;
            }
            if (((uVar8 & 4) != 0) &&
               ((this->features).descriptor_indexing.descriptorBindingPartiallyBound == 0)) {
              return bVar16;
            }
            if ((uVar8 & 8) == 0) goto LAB_0010a3e7;
            VVar3 = (this->features).descriptor_indexing.descriptorBindingVariableDescriptorCount;
            goto joined_r0x00109b5a;
          }
          pcVar14 = "VK_EXT_conservative_rasterization";
        }
LAB_0010a002:
        std::__cxx11::string::string((string *)&pdf2,pcVar14,(allocator *)&robust_image);
        sVar10 = std::
                 _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::count((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                          *)this,(key_type *)&pdf2);
        std::__cxx11::string::_M_dispose();
        if (sVar10 == 0) {
          return false;
        }
      }
    }
LAB_0010a3e7:
    pNext = *(void **)((long)pNext + 8);
  } while( true );
}

Assistant:

bool FeatureFilter::Impl::pnext_chain_is_supported(const void *pNext) const
{
	while (pNext)
	{
		auto *base = static_cast<const VkBaseInStructure *>(pNext);

		// These are the currently pNext structs which Fossilize serialize.

		switch (base->sType)
		{
		case VK_STRUCTURE_TYPE_PIPELINE_TESSELLATION_DOMAIN_ORIGIN_STATE_CREATE_INFO:
			if (!enabled_extensions.count(VK_KHR_MAINTENANCE2_EXTENSION_NAME) && api_version < VK_API_VERSION_1_1)
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_DIVISOR_STATE_CREATE_INFO_KHR:
		{
			if (!enabled_extensions.count(VK_EXT_VERTEX_ATTRIBUTE_DIVISOR_EXTENSION_NAME) &&
			    !enabled_extensions.count(VK_KHR_VERTEX_ATTRIBUTE_DIVISOR_EXTENSION_NAME))
				return false;

			auto *divisor = static_cast<const VkPipelineVertexInputDivisorStateCreateInfoEXT *>(pNext);
			bool use_zero_divisor = false;
			bool use_non_identity_divisor = false;
			uint32_t max_divisor = 0;

			for (uint32_t i = 0; i < divisor->vertexBindingDivisorCount; i++)
			{
				if (divisor->pVertexBindingDivisors[i].divisor != 1)
					use_non_identity_divisor = true;
				if (divisor->pVertexBindingDivisors[i].divisor == 0)
					use_zero_divisor = true;
				max_divisor = (std::max)(max_divisor, divisor->pVertexBindingDivisors[i].divisor);
			}

			if (max_divisor > props.attribute_divisor.maxVertexAttribDivisor)
				return false;
			if (use_zero_divisor && !features.attribute_divisor.vertexAttributeInstanceRateZeroDivisor)
				return false;
			if (use_non_identity_divisor && !features.attribute_divisor.vertexAttributeInstanceRateDivisor)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_DEPTH_CLIP_STATE_CREATE_INFO_EXT:
		{
			auto *clip = static_cast<const VkPipelineRasterizationDepthClipStateCreateInfoEXT *>(pNext);
			if (clip->depthClipEnable && !features.depth_clip.depthClipEnable)
				return false;
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_STREAM_CREATE_INFO_EXT:
			if (features.transform_feedback.geometryStreams == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_MULTIVIEW_CREATE_INFO:
		{
			if (features.multiview.multiview == VK_FALSE)
				return false;

			auto *multiview = static_cast<const VkRenderPassMultiviewCreateInfo *>(pNext);

			for (uint32_t i = 0; i < multiview->subpassCount; i++)
			{
				if (!multiview_mask_is_supported(multiview->pViewMasks[i]))
					return false;
			}

			for (uint32_t i = 0; i < multiview->correlationMaskCount; i++)
			{
				if (!multiview_mask_is_supported(multiview->pCorrelationMasks[i]))
					return false;
			}

			break;
		}

		case VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_BINDING_FLAGS_CREATE_INFO_EXT:
		{
			auto *flags = static_cast<const VkDescriptorSetLayoutBindingFlagsCreateInfo *>(pNext);
			VkDescriptorBindingFlagsEXT flag_union = 0;
			for (uint32_t i = 0; i < flags->bindingCount; i++)
				flag_union |= flags->pBindingFlags[i];

			if ((flag_union & VK_DESCRIPTOR_BINDING_UPDATE_UNUSED_WHILE_PENDING_BIT) != 0 &&
			    features.descriptor_indexing.descriptorBindingUpdateUnusedWhilePending == VK_FALSE)
			{
				return false;
			}

			if ((flag_union & VK_DESCRIPTOR_BINDING_PARTIALLY_BOUND_BIT) != 0 &&
			    features.descriptor_indexing.descriptorBindingPartiallyBound == VK_FALSE)
			{
				return false;
			}

			if ((flag_union & VK_DESCRIPTOR_BINDING_VARIABLE_DESCRIPTOR_COUNT_BIT) != 0 &&
			    features.descriptor_indexing.descriptorBindingVariableDescriptorCount == VK_FALSE)
			{
				return false;
			}

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_ADVANCED_STATE_CREATE_INFO_EXT:
			if (features.blend_operation_advanced.advancedBlendCoherentOperations == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_CONSERVATIVE_STATE_CREATE_INFO_EXT:
			if (!enabled_extensions.count(VK_EXT_CONSERVATIVE_RASTERIZATION_EXTENSION_NAME))
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_LINE_STATE_CREATE_INFO_KHR:
		{
			auto *line = static_cast<const VkPipelineRasterizationLineStateCreateInfoKHR *>(pNext);
			if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_RECTANGULAR_KHR &&
			    features.line_rasterization.rectangularLines == VK_FALSE)
			{
				return false;
			}

			if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_BRESENHAM_KHR &&
			    features.line_rasterization.bresenhamLines == VK_FALSE)
			{
				return false;
			}

			if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_RECTANGULAR_SMOOTH_KHR &&
			    features.line_rasterization.smoothLines == VK_FALSE)
			{
				return false;
			}

			if (line->stippledLineEnable == VK_TRUE)
			{
				if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_RECTANGULAR_KHR &&
				    features.line_rasterization.stippledRectangularLines == VK_FALSE)
				{
					return false;
				}

				if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_BRESENHAM_KHR &&
				    features.line_rasterization.stippledBresenhamLines == VK_FALSE)
				{
					return false;
				}

				if (line->lineRasterizationMode == VK_LINE_RASTERIZATION_MODE_RECTANGULAR_SMOOTH_KHR &&
				    features.line_rasterization.stippledSmoothLines == VK_FALSE)
				{
					return false;
				}
			}

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_REQUIRED_SUBGROUP_SIZE_CREATE_INFO_EXT:
			// The details are validated explicitly elsewhere since we need to know the shader create info to deduce correctness.
			break;

		case VK_STRUCTURE_TYPE_MUTABLE_DESCRIPTOR_TYPE_CREATE_INFO_EXT:
		{
			if (features.mutable_descriptor_type.mutableDescriptorType == VK_FALSE)
				return false;

			auto *lists = static_cast<const VkMutableDescriptorTypeCreateInfoEXT *>(pNext);
			for (uint32_t i = 0; i < lists->mutableDescriptorTypeListCount; i++)
			{
				for (uint32_t j = 0; j < lists->pMutableDescriptorTypeLists[i].descriptorTypeCount; j++)
				{
					switch (lists->pMutableDescriptorTypeLists[i].pDescriptorTypes[j])
					{
					case VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER:
					case VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER:
					case VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER:
					case VK_DESCRIPTOR_TYPE_STORAGE_BUFFER:
					case VK_DESCRIPTOR_TYPE_SAMPLED_IMAGE:
					case VK_DESCRIPTOR_TYPE_STORAGE_IMAGE:
					case VK_DESCRIPTOR_TYPE_SAMPLER:
						break;

					default:
						// Implementation can theoretically support beyond this (and we'd have to query support),
						// but validate against what is required.
						return false;
					}
				}
			}

			break;
		}

		case VK_STRUCTURE_TYPE_ATTACHMENT_DESCRIPTION_STENCIL_LAYOUT:
		{
			if (!features.separate_ds_layout.separateDepthStencilLayouts)
				return false;

			auto *layout = static_cast<const VkAttachmentDescriptionStencilLayout *>(pNext);
			if (!image_layout_is_supported(layout->stencilInitialLayout))
				return false;
			if (!image_layout_is_supported(layout->stencilFinalLayout))
				return false;
			break;
		}

		case VK_STRUCTURE_TYPE_ATTACHMENT_REFERENCE_STENCIL_LAYOUT:
		{
			if (!features.separate_ds_layout.separateDepthStencilLayouts)
				return false;

			auto *layout = static_cast<const VkAttachmentReferenceStencilLayout *>(pNext);
			if (!image_layout_is_supported(layout->stencilLayout))
				return false;
			break;
		}

		case VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE:
		{
			if (api_version < VK_API_VERSION_1_2 && !enabled_extensions.count(VK_KHR_DEPTH_STENCIL_RESOLVE_EXTENSION_NAME))
				return false;

			auto *resolve = static_cast<const VkSubpassDescriptionDepthStencilResolve *>(pNext);

			if (!resolve->pDepthStencilResolveAttachment)
				break;

			if (!attachment_reference2_is_supported(*resolve->pDepthStencilResolveAttachment))
				return false;

			if (resolve->depthResolveMode &&
			    (props.ds_resolve.supportedDepthResolveModes & resolve->depthResolveMode) == 0)
				return false;

			if (resolve->stencilResolveMode &&
			    (props.ds_resolve.supportedStencilResolveModes & resolve->stencilResolveMode) == 0)
				return false;

			if (resolve->depthResolveMode != resolve->stencilResolveMode)
			{
				bool use_zero = resolve->depthResolveMode == VK_RESOLVE_MODE_NONE ||
				                resolve->stencilResolveMode == VK_RESOLVE_MODE_NONE;

				auto cond = use_zero ?
				            props.ds_resolve.independentResolveNone :
				            props.ds_resolve.independentResolve;
				if (!cond)
					return false;
			}

			if (resolve->depthResolveMode == VK_RESOLVE_MODE_EXTERNAL_FORMAT_DOWNSAMPLE_ANDROID ||
			    resolve->stencilResolveMode == VK_RESOLVE_MODE_EXTERNAL_FORMAT_DOWNSAMPLE_ANDROID)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR:
		{
			if (!features.fragment_shading_rate.attachmentFragmentShadingRate)
				return false;

			auto *attachment = static_cast<const VkFragmentShadingRateAttachmentInfoKHR *>(pNext);

			if (!attachment->pFragmentShadingRateAttachment)
				break;

			if (!attachment_reference2_is_supported(*attachment->pFragmentShadingRateAttachment))
				return false;

			uint32_t width = attachment->shadingRateAttachmentTexelSize.width;
			uint32_t height = attachment->shadingRateAttachmentTexelSize.height;

			if (width == 0 || height == 0)
				return false;

			if (width < props.fragment_shading_rate.minFragmentShadingRateAttachmentTexelSize.width)
				return false;
			if (width > props.fragment_shading_rate.maxFragmentShadingRateAttachmentTexelSize.width)
				return false;
			if (height < props.fragment_shading_rate.minFragmentShadingRateAttachmentTexelSize.height)
				return false;
			if (height > props.fragment_shading_rate.maxFragmentShadingRateAttachmentTexelSize.height)
				return false;

			uint32_t higher = (std::max)(width, height);
			uint32_t lower = (std::min)(width, height);
			uint32_t aspect = higher / lower;
			if (aspect > props.fragment_shading_rate.maxFragmentShadingRateAttachmentTexelSizeAspectRatio)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RENDERING_CREATE_INFO_KHR:
		{
			if (features.dynamic_rendering.dynamicRendering == VK_FALSE)
				return false;

			auto *info = static_cast<const VkPipelineRenderingCreateInfoKHR *>(pNext);

			for (uint32_t i = 0; i < info->colorAttachmentCount; i++)
			{
				if (info->pColorAttachmentFormats[i] != VK_FORMAT_UNDEFINED &&
				    !format_is_supported(info->pColorAttachmentFormats[i], VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT))
				{
					return false;
				}
			}

			if (info->depthAttachmentFormat != VK_FORMAT_UNDEFINED &&
			    !format_is_supported(info->depthAttachmentFormat, VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT))
			{
				return false;
			}

			if (info->stencilAttachmentFormat != VK_FORMAT_UNDEFINED &&
			    !format_is_supported(info->stencilAttachmentFormat, VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT))
			{
				return false;
			}

			if (info->depthAttachmentFormat != VK_FORMAT_UNDEFINED &&
			    info->stencilAttachmentFormat != VK_FORMAT_UNDEFINED &&
			    info->depthAttachmentFormat != info->stencilAttachmentFormat)
			{
				return false;
			}

			if (info->viewMask && !multiview_mask_is_supported(info->viewMask))
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_COLOR_WRITE_CREATE_INFO_EXT:
		{
			if (!features.color_write_enable.colorWriteEnable)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_PROVOKING_VERTEX_STATE_CREATE_INFO_EXT:
		{
			if (!enabled_extensions.count(VK_EXT_PROVOKING_VERTEX_EXTENSION_NAME))
				return false;

			auto *info = static_cast<const VkPipelineRasterizationProvokingVertexStateCreateInfoEXT *>(pNext);

			if (info->provokingVertexMode == VK_PROVOKING_VERTEX_MODE_LAST_VERTEX_EXT &&
			    !features.provoking_vertex.provokingVertexLast)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_CUSTOM_BORDER_COLOR_CREATE_INFO_EXT:
		{
			if (!enabled_extensions.count(VK_EXT_CUSTOM_BORDER_COLOR_EXTENSION_NAME))
				return false;

			auto *info = static_cast<const VkSamplerCustomBorderColorCreateInfoEXT *>(pNext);

			if (info->format == VK_FORMAT_UNDEFINED &&
			    !features.custom_border_color.customBorderColorWithoutFormat)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_REDUCTION_MODE_CREATE_INFO:
		{
			if (!enabled_extensions.count(VK_EXT_SAMPLER_FILTER_MINMAX_EXTENSION_NAME) && !features.vk12.samplerFilterMinmax)
				return false;

			auto *info = static_cast<const VkSamplerReductionModeCreateInfo *>(pNext);
			switch (info->reductionMode)
			{
			case VK_SAMPLER_REDUCTION_MODE_MAX:
			case VK_SAMPLER_REDUCTION_MODE_MIN:
			case VK_SAMPLER_REDUCTION_MODE_WEIGHTED_AVERAGE:
				break;

			default:
				return false;
			}

			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_INPUT_ATTACHMENT_ASPECT_CREATE_INFO:
		{
			if (!enabled_extensions.count(VK_KHR_MAINTENANCE_2_EXTENSION_NAME) && api_version < VK_API_VERSION_1_1)
				return false;

			auto *info = static_cast<const VkRenderPassInputAttachmentAspectCreateInfo *>(pNext);
			for (uint32_t i = 0; i < info->aspectReferenceCount; i++)
				if (!aspect_mask_is_supported(info->pAspectReferences[i].aspectMask))
					return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_DISCARD_RECTANGLE_STATE_CREATE_INFO_EXT:
		{
			if (!enabled_extensions.count(VK_EXT_DISCARD_RECTANGLES_EXTENSION_NAME))
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_MEMORY_BARRIER_2_KHR:
		{
			if (!features.synchronization2.synchronization2)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_FRAGMENT_SHADING_RATE_STATE_CREATE_INFO_KHR:
		{
			if (!features.fragment_shading_rate.pipelineFragmentShadingRate)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_INFO:
		case VK_STRUCTURE_TYPE_SAMPLER_YCBCR_CONVERSION_CREATE_INFO:
		{
			// Should also validate formats and all sorts of feature bits, but
			// consider that TODO for now.
			// YcbcrConversionCreateInfo is inlined into a VkSamplerCreateInfo when replaying from a Fossilize archive.
			// Normally, it's not a pNext, but we pretend it is to make capture and replay
			// a bit more sane.
			if (!features.ycbcr_conversion.samplerYcbcrConversion)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_LIBRARY_CREATE_INFO_KHR:
		case VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT:
		{
			if (features.graphics_pipeline_library.graphicsPipelineLibrary == VK_FALSE)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_SAMPLE_LOCATIONS_STATE_CREATE_INFO_EXT:
		{
			if (!enabled_extensions.count(VK_EXT_SAMPLE_LOCATIONS_EXTENSION_NAME))
				return false;

			auto *info = static_cast<const VkPipelineSampleLocationsStateCreateInfoEXT *>(pNext);
			// If count is 0, this is part of dynamic state, so just ignore it.
			if (!info->sampleLocationsEnable || info->sampleLocationsInfo.sampleLocationsCount == 0)
				break;

			if (info->sampleLocationsInfo.sampleLocationGridSize.width > props.sample_locations.maxSampleLocationGridSize.width ||
			    info->sampleLocationsInfo.sampleLocationGridSize.height > props.sample_locations.maxSampleLocationGridSize.height)
			{
				return false;
			}

			if ((props.sample_locations.sampleLocationSampleCounts & info->sampleLocationsInfo.sampleLocationsPerPixel) == 0)
				return false;

			// Sample positions are clamped by implementation.
			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLIP_CONTROL_CREATE_INFO_EXT:
		{
			if (!features.depth_clip_control.depthClipControl)
			{
				return false;
			}

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_ROBUSTNESS_CREATE_INFO_EXT:
		{
			if (enabled_extensions.count(VK_EXT_PIPELINE_ROBUSTNESS_EXTENSION_NAME) == 0)
				return false;
			auto *info = static_cast<const VkPipelineRobustnessCreateInfoEXT *>(pNext);

			if ((info->storageBuffers != VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_DEVICE_DEFAULT_EXT ||
			     info->images != VK_PIPELINE_ROBUSTNESS_IMAGE_BEHAVIOR_DEVICE_DEFAULT_EXT ||
			     info->uniformBuffers != VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_DEVICE_DEFAULT_EXT ||
			     info->vertexInputs != VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_DEVICE_DEFAULT_EXT) &&
			    features.pipeline_robustness.pipelineRobustness == VK_FALSE)
			{
				return false;
			}

			if (!query)
				return false;

			bool need_robust_image =
					info->images == VK_PIPELINE_ROBUSTNESS_IMAGE_BEHAVIOR_ROBUST_IMAGE_ACCESS_EXT;
			bool need_robust_image2 =
					info->images == VK_PIPELINE_ROBUSTNESS_IMAGE_BEHAVIOR_ROBUST_IMAGE_ACCESS_2_EXT;
			bool need_robust_buffer2 =
					info->storageBuffers == VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_ROBUST_BUFFER_ACCESS_2_EXT ||
					info->vertexInputs == VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_ROBUST_BUFFER_ACCESS_2_EXT ||
					info->uniformBuffers == VK_PIPELINE_ROBUSTNESS_BUFFER_BEHAVIOR_ROBUST_BUFFER_ACCESS_2_EXT;

			// From spec:
			// Any component of the implementation (the loader, any enabled layers, and drivers) must skip over,
			// without processing (other than reading the sType and pNext members)
			// any extending structures in the chain not defined by core versions
			// or extensions supported by that component.
			// I.e. it's safe for us to query the struct, even if the extension is not supported.

			if (need_robust_image)
			{
				VkPhysicalDeviceFeatures2 pdf2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
				VkPhysicalDeviceImageRobustnessFeaturesEXT robust_image =
						{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_IMAGE_ROBUSTNESS_FEATURES_EXT };
				pdf2.pNext = &robust_image;
				query->physical_device_feature_query(&pdf2);
				if (robust_image.robustImageAccess == VK_FALSE)
					return false;
			}

			if (need_robust_image2)
			{
				VkPhysicalDeviceFeatures2 pdf2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
				VkPhysicalDeviceRobustness2FeaturesEXT robust2 =
						{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT };
				pdf2.pNext = &robust2;
				query->physical_device_feature_query(&pdf2);
				if (robust2.robustImageAccess2 == VK_FALSE)
					return false;
			}

			if (need_robust_buffer2)
			{
				VkPhysicalDeviceFeatures2 pdf2 = { VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_FEATURES_2 };
				VkPhysicalDeviceRobustness2FeaturesEXT robust2 =
						{ VK_STRUCTURE_TYPE_PHYSICAL_DEVICE_ROBUSTNESS_2_FEATURES_EXT };
				pdf2.pNext = &robust2;
				query->physical_device_feature_query(&pdf2);
				if (robust2.robustBufferAccess2 == VK_FALSE)
					return false;
			}

			break;
		}

		case VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR:
			// Actual flags are validated separately.
			if (features.maintenance5.maintenance5 == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDER_PASS_CREATION_CONTROL_EXT:
			if (features.subpass_merge_feedback.subpassMergeFeedback == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLER_BORDER_COLOR_COMPONENT_MAPPING_CREATE_INFO_EXT:
			if (features.border_color_swizzle.borderColorSwizzle == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_MULTISAMPLED_RENDER_TO_SINGLE_SAMPLED_INFO_EXT:
			if (features.multisampled_render_to_single_sampled.multisampledRenderToSingleSampled == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_DEPTH_BIAS_REPRESENTATION_INFO_EXT:
		{
			if (enabled_extensions.count(VK_EXT_DEPTH_BIAS_CONTROL_EXTENSION_NAME) == 0)
				return false;

			auto *info = static_cast<const VkDepthBiasRepresentationInfoEXT *>(pNext);
			if (info->depthBiasRepresentation == VK_DEPTH_BIAS_REPRESENTATION_LEAST_REPRESENTABLE_VALUE_FORCE_UNORM_EXT &&
			    features.depth_bias_control.leastRepresentableValueForceUnormRepresentation == VK_FALSE)
				return false;

			if (info->depthBiasRepresentation == VK_DEPTH_BIAS_REPRESENTATION_FLOAT_EXT &&
			    features.depth_bias_control.floatRepresentation == VK_FALSE)
				return false;

			break;
		}

		case VK_STRUCTURE_TYPE_RENDER_PASS_FRAGMENT_DENSITY_MAP_CREATE_INFO_EXT:
			if (features.fragment_density.fragmentDensityMap == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_SAMPLE_LOCATIONS_INFO_EXT:
			if (enabled_extensions.count(VK_EXT_SAMPLE_LOCATIONS_EXTENSION_NAME) == 0)
				return false;
			break;

		case VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_DEPTH_CLAMP_CONTROL_CREATE_INFO_EXT:
			if (features.depth_clamp_control.depthClampControl == VK_FALSE)
				return false;
			break;

		case VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_LOCATION_INFO_KHR:
		case VK_STRUCTURE_TYPE_RENDERING_INPUT_ATTACHMENT_INDEX_INFO_KHR:
		{
			if (features.dynamic_rendering_local_read.dynamicRenderingLocalRead == VK_FALSE)
				return false;
			break;
		}

		default:
			LOGE("Unrecognized pNext sType: %u. Treating as unsupported.\n", unsigned(base->sType));
			return false;
		}

		pNext = base->pNext;
	}
	return true;
}